

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectiveDipoleDisplacement.cpp
# Opt level: O2

void __thiscall
OpenMD::CollectiveDipoleDisplacement::CollectiveDipoleDisplacement
          (CollectiveDipoleDisplacement *this,SimInfo *info,string *filename,string *sele1,
          string *sele2)

{
  ostream *poVar1;
  Thermo *pTVar2;
  string labelString;
  stringstream label;
  ostream local_1a0 [376];
  
  SystemACF<OpenMD::Vector3<double>_>::SystemACF
            (&this->super_SystemACF<OpenMD::Vector3<double>_>,info,filename,sele1,sele2);
  (this->super_SystemACF<OpenMD::Vector3<double>_>).super_AutoCorrFunc<OpenMD::Vector3<double>_>.
  super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty._vptr_DynamicProperty =
       (_func_int **)&PTR__CollectiveDipoleDisplacement_002b5bd8;
  (this->CRcm_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CRcm_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CRcm_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CRtot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CRtot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CRtot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CRrot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CRrot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CRrot_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&label,"Collective Dipole Displacement Function",
             (allocator<char> *)&labelString);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_SystemACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.corrFuncType_);
  std::__cxx11::string::~string((string *)&label);
  getPrefix(&labelString,
            &(this->super_SystemACF<OpenMD::Vector3<double>_>).
             super_AutoCorrFunc<OpenMD::Vector3<double>_>.
             super_TimeCorrFunc<OpenMD::Vector3<double>_>.dumpFilename_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&label,
                 &labelString,".ddisp");
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_SystemACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty.outputFilename_);
  std::__cxx11::string::~string((string *)&label);
  std::__cxx11::string::~string((string *)&labelString);
  std::__cxx11::stringstream::stringstream((stringstream *)&label);
  poVar1 = std::operator<<(local_1a0,"<|Mtrans(t)-Mtrans(0)|^2>\t");
  poVar1 = std::operator<<(poVar1,"<|Mtot(t)-Mtot(0)|^2>\t");
  std::operator<<(poVar1,"<|Mrot(t)-Mrot(0)|^2>");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_SystemACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.labelString_);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->CRcm_,
             (long)(this->super_SystemACF<OpenMD::Vector3<double>_>).
                   super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                   super_TimeCorrFunc<OpenMD::Vector3<double>_>.nFrames_,
             (value_type *)OpenMD::V3Zero);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->CRtot_,
             (long)(this->super_SystemACF<OpenMD::Vector3<double>_>).
                   super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                   super_TimeCorrFunc<OpenMD::Vector3<double>_>.nFrames_,
             (value_type *)OpenMD::V3Zero);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->CRrot_,
             (long)(this->super_SystemACF<OpenMD::Vector3<double>_>).
                   super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                   super_TimeCorrFunc<OpenMD::Vector3<double>_>.nFrames_,
             (value_type *)OpenMD::V3Zero);
  pTVar2 = (Thermo *)operator_new(8);
  pTVar2->info_ =
       (this->super_SystemACF<OpenMD::Vector3<double>_>).
       super_AutoCorrFunc<OpenMD::Vector3<double>_>.super_TimeCorrFunc<OpenMD::Vector3<double>_>.
       info_;
  this->thermo_ = pTVar2;
  std::__cxx11::string::~string((string *)&labelString);
  std::__cxx11::stringstream::~stringstream((stringstream *)&label);
  return;
}

Assistant:

CollectiveDipoleDisplacement::CollectiveDipoleDisplacement(
      SimInfo* info, const string& filename, const string& sele1,
      const std::string& sele2) :
      SystemACF<Vector3d>(info, filename, sele1, sele2) {
    setCorrFuncType("Collective Dipole Displacement Function");
    setOutputName(getPrefix(dumpFilename_) + ".ddisp");

    std::stringstream label;
    label << "<|Mtrans(t)-Mtrans(0)|^2>\t"
          << "<|Mtot(t)-Mtot(0)|^2>\t"
          << "<|Mrot(t)-Mrot(0)|^2>";
    const std::string labelString = label.str();
    setLabelString(labelString);

    CRcm_.resize(nFrames_, V3Zero);
    CRtot_.resize(nFrames_, V3Zero);
    CRrot_.resize(nFrames_, V3Zero);

    // We'll need thermo to compute the volume:
    thermo_ = new Thermo(info_);
  }